

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_platform.c
# Opt level: O2

size_t light_size(__fd_t fd)

{
  long __off;
  size_t sVar1;
  
  __off = ftell((FILE *)fd);
  fseek((FILE *)fd,0,2);
  sVar1 = ftell((FILE *)fd);
  fseek((FILE *)fd,__off,0);
  return sVar1;
}

Assistant:

size_t light_size(__fd_t fd)
{
	size_t size = 0;
	size_t current = ftell(fd);

	fseek(fd, 0, SEEK_END);
	size = ftell(fd);
	fseek(fd, current, SEEK_SET);

	return size;
}